

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_realloc.h
# Opt level: O0

void __thiscall
vector_realloc_counter_clear<unsigned_char_*,_16U>::push_back
          (vector_realloc_counter_clear<unsigned_char_*,_16U> *this,uchar **t)

{
  uchar **t_local;
  vector_realloc_counter_clear<unsigned_char_*,_16U> *this_local;
  
  if (this->_size == this->_capacity) {
    grow(this);
  }
  this->_data[this->_size] = *t;
  this->_size = this->_size + 1;
  return;
}

Assistant:

void push_back(const T& t)
	{
		if (_size == _capacity) { grow(); }
		_data[_size] = t;
		++_size;
	}